

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O3

void aom_get_blk_sse_sum_sse2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  int iVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  int i;
  long lVar8;
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  *x_sum = 0;
  *x2_sum = 0;
  auVar19 = _DAT_0050d400;
  if ((bh & 3U) != 0) {
LAB_00311bb1:
    aom_get_blk_sse_sum_c(data,stride,bw,bh,x_sum,x2_sum);
    return;
  }
  if (bw < 0x10) {
    if (bw == 4) {
      iVar10 = bh >> 1;
      if (iVar10 < 1) {
        auVar19 = (undefined1  [16])0x0;
        iVar11 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar7 = 0;
      }
      else {
        iVar11 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar7 = 0;
        auVar9 = (undefined1  [16])0x0;
        do {
          auVar18._8_8_ = *(undefined8 *)(data + stride);
          auVar18._0_8_ = *(undefined8 *)data;
          auVar19 = pmaddwd(auVar18,_DAT_0050d400);
          iVar11 = iVar11 + auVar19._0_4_;
          iVar12 = iVar12 + auVar19._4_4_;
          iVar13 = iVar13 + auVar19._8_4_;
          iVar7 = iVar7 + auVar19._12_4_;
          auVar18 = pmaddwd(auVar18,auVar18);
          auVar19._0_4_ = auVar9._0_4_ + auVar18._0_4_;
          auVar19._4_4_ = auVar9._4_4_ + auVar18._4_4_;
          auVar19._8_4_ = auVar9._8_4_ + auVar18._8_4_;
          auVar19._12_4_ = auVar9._12_4_ + auVar18._12_4_;
          data = data + stride * 2;
          iVar10 = iVar10 + -1;
          auVar9 = auVar19;
        } while (iVar10 != 0);
      }
      *x_sum = iVar7 + iVar12 + iVar13 + iVar11;
      *x2_sum = (ulong)auVar19._12_4_ + (ulong)auVar19._4_4_ +
                (ulong)auVar19._8_4_ + (auVar19._0_8_ & 0xffffffff);
      return;
    }
    if (bw != 8) goto LAB_00311bb1;
  }
  else if (bw != 0x10) {
    if (bw == 0x20) {
      if (0x20 < bh) {
        iVar10 = 0;
        iVar11 = 0;
        iVar12 = 0;
        iVar13 = 0;
        lVar1 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        pauVar2 = (undefined1 (*) [16])data;
        do {
          iVar7 = 0x20;
          pauVar6 = pauVar2;
          do {
            auVar9 = *pauVar6;
            auVar18 = pmaddwd(auVar9,_DAT_0050d400);
            iVar10 = iVar10 + auVar18._0_4_;
            iVar11 = iVar11 + auVar18._4_4_;
            iVar12 = iVar12 + auVar18._8_4_;
            iVar13 = iVar13 + auVar18._12_4_;
            auVar9 = pmaddwd(auVar9,auVar9);
            uVar14 = uVar14 + auVar9._0_4_;
            uVar15 = uVar15 + auVar9._4_4_;
            uVar16 = uVar16 + auVar9._8_4_;
            uVar17 = uVar17 + auVar9._12_4_;
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)stride * 2);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          lVar1 = lVar1 + 1;
          pauVar2 = pauVar2 + 1;
        } while (lVar1 != 4);
        iVar10 = iVar13 + iVar11 + iVar12 + iVar10;
        *x_sum = iVar10;
        iVar11 = 0;
        iVar12 = 0;
        iVar13 = 0;
        iVar7 = 0;
        lVar3 = (ulong)uVar17 + (ulong)uVar15 + (ulong)uVar16 + (ulong)uVar14;
        *x2_sum = lVar3;
        pauVar2 = (undefined1 (*) [16])(data + (stride << 5));
        lVar1 = 0;
        uVar14 = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        do {
          iVar4 = 0x20;
          pauVar6 = pauVar2;
          do {
            auVar9 = *pauVar6;
            auVar18 = pmaddwd(auVar9,auVar19);
            iVar11 = iVar11 + auVar18._0_4_;
            iVar12 = iVar12 + auVar18._4_4_;
            iVar13 = iVar13 + auVar18._8_4_;
            iVar7 = iVar7 + auVar18._12_4_;
            auVar9 = pmaddwd(auVar9,auVar9);
            uVar14 = uVar14 + auVar9._0_4_;
            uVar15 = uVar15 + auVar9._4_4_;
            uVar16 = uVar16 + auVar9._8_4_;
            uVar17 = uVar17 + auVar9._12_4_;
            pauVar6 = (undefined1 (*) [16])(*pauVar6 + (long)stride * 2);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          lVar1 = lVar1 + 1;
          pauVar2 = pauVar2 + 1;
        } while (lVar1 != 4);
        *x_sum = iVar13 + iVar11 + iVar10 + iVar7 + iVar12;
        *x2_sum = (ulong)uVar16 + (ulong)uVar14 + lVar3 + (ulong)uVar17 + (ulong)uVar15;
        return;
      }
      auVar9 = (undefined1  [16])0x0;
      iVar10 = 0;
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = 0;
      lVar1 = 0;
      do {
        pauVar2 = (undefined1 (*) [16])data;
        auVar19 = auVar9;
        iVar7 = bh;
        if (0 < bh) {
          do {
            auVar9 = *pauVar2;
            auVar18 = pmaddwd(auVar9,_DAT_0050d400);
            iVar10 = iVar10 + auVar18._0_4_;
            iVar11 = iVar11 + auVar18._4_4_;
            iVar12 = iVar12 + auVar18._8_4_;
            iVar13 = iVar13 + auVar18._12_4_;
            auVar18 = pmaddwd(auVar9,auVar9);
            auVar9._0_4_ = auVar19._0_4_ + auVar18._0_4_;
            auVar9._4_4_ = auVar19._4_4_ + auVar18._4_4_;
            auVar9._8_4_ = auVar19._8_4_ + auVar18._8_4_;
            auVar9._12_4_ = auVar19._12_4_ + auVar18._12_4_;
            iVar7 = iVar7 + -1;
            pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 2);
            auVar19 = auVar9;
          } while (iVar7 != 0);
        }
        lVar1 = lVar1 + 1;
        data = (int16_t *)((long)data + 0x10);
      } while (lVar1 != 4);
    }
    else {
      if (bw != 0x40) goto LAB_00311bb1;
      lVar1 = (long)stride;
      if (0x10 < bh) {
        uVar5 = 0;
        lVar3 = 0;
        iVar10 = 0;
        do {
          lVar8 = 0;
          iVar11 = 0;
          iVar12 = 0;
          iVar13 = 0;
          iVar7 = 0;
          uVar14 = 0;
          uVar15 = 0;
          uVar16 = 0;
          uVar17 = 0;
          pauVar2 = (undefined1 (*) [16])data;
          do {
            iVar4 = 0x10;
            pauVar6 = pauVar2;
            do {
              auVar9 = *pauVar6;
              auVar18 = pmaddwd(auVar9,auVar19);
              iVar11 = iVar11 + auVar18._0_4_;
              iVar12 = iVar12 + auVar18._4_4_;
              iVar13 = iVar13 + auVar18._8_4_;
              iVar7 = iVar7 + auVar18._12_4_;
              auVar9 = pmaddwd(auVar9,auVar9);
              uVar14 = uVar14 + auVar9._0_4_;
              uVar15 = uVar15 + auVar9._4_4_;
              uVar16 = uVar16 + auVar9._8_4_;
              uVar17 = uVar17 + auVar9._12_4_;
              pauVar6 = (undefined1 (*) [16])(*pauVar6 + lVar1 * 2);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            lVar8 = lVar8 + 1;
            pauVar2 = pauVar2 + 1;
          } while (lVar8 != 8);
          iVar10 = iVar10 + iVar7 + iVar12 + iVar13 + iVar11;
          *x_sum = iVar10;
          lVar3 = lVar3 + (ulong)uVar17 + (ulong)uVar15 + (ulong)uVar16 + (ulong)uVar14;
          *x2_sum = lVar3;
          uVar5 = uVar5 + 0x10;
          data = (int16_t *)((long)data + lVar1 * 2 * 0x10);
        } while (uVar5 < (uint)bh);
        return;
      }
      auVar9 = (undefined1  [16])0x0;
      iVar10 = 0;
      iVar11 = 0;
      iVar12 = 0;
      iVar13 = 0;
      lVar3 = 0;
      do {
        pauVar2 = (undefined1 (*) [16])data;
        auVar19 = auVar9;
        iVar7 = bh;
        if (0 < bh) {
          do {
            auVar9 = *pauVar2;
            auVar18 = pmaddwd(auVar9,_DAT_0050d400);
            iVar10 = iVar10 + auVar18._0_4_;
            iVar11 = iVar11 + auVar18._4_4_;
            iVar12 = iVar12 + auVar18._8_4_;
            iVar13 = iVar13 + auVar18._12_4_;
            auVar18 = pmaddwd(auVar9,auVar9);
            auVar9._0_4_ = auVar19._0_4_ + auVar18._0_4_;
            auVar9._4_4_ = auVar19._4_4_ + auVar18._4_4_;
            auVar9._8_4_ = auVar19._8_4_ + auVar18._8_4_;
            auVar9._12_4_ = auVar19._12_4_ + auVar18._12_4_;
            iVar7 = iVar7 + -1;
            pauVar2 = (undefined1 (*) [16])(*pauVar2 + lVar1 * 2);
            auVar19 = auVar9;
          } while (iVar7 != 0);
        }
        lVar3 = lVar3 + 1;
        data = (int16_t *)((long)data + 0x10);
      } while (lVar3 != 8);
    }
    goto LAB_00311c92;
  }
  auVar9 = (undefined1  [16])0x0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  uVar5 = 0;
  do {
    pauVar2 = (undefined1 (*) [16])data;
    auVar19 = auVar9;
    iVar7 = bh;
    if (0 < bh) {
      do {
        auVar9 = *pauVar2;
        auVar18 = pmaddwd(auVar9,_DAT_0050d400);
        iVar10 = iVar10 + auVar18._0_4_;
        iVar11 = iVar11 + auVar18._4_4_;
        iVar12 = iVar12 + auVar18._8_4_;
        iVar13 = iVar13 + auVar18._12_4_;
        auVar18 = pmaddwd(auVar9,auVar9);
        auVar9._0_4_ = auVar19._0_4_ + auVar18._0_4_;
        auVar9._4_4_ = auVar19._4_4_ + auVar18._4_4_;
        auVar9._8_4_ = auVar19._8_4_ + auVar18._8_4_;
        auVar9._12_4_ = auVar19._12_4_ + auVar18._12_4_;
        iVar7 = iVar7 + -1;
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 2);
        auVar19 = auVar9;
      } while (iVar7 != 0);
    }
    uVar5 = uVar5 + 1;
    data = (int16_t *)((long)data + 0x10);
  } while (uVar5 != (uint)bw >> 3);
LAB_00311c92:
  *x_sum = iVar13 + iVar11 + iVar12 + iVar10;
  *x2_sum = (ulong)auVar9._12_4_ + (ulong)auVar9._4_4_ +
            (ulong)auVar9._8_4_ + (auVar9._0_8_ & 0xffffffff);
  return;
}

Assistant:

void aom_get_blk_sse_sum_sse2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
      case 4: sse_sum_wd4_sse2(data, stride, bh, x_sum, x2_sum); break;
      case 8:
      case 16:
        sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
        break;
        // For widths 32 and 64, the registers may overflow. So compute
        // partial widths at a time.
      case 32:
        if (bh <= 32) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          sse_sum_wd8_sse2(data, stride, 32, x_sum, x2_sum, bw >> 3);
          sse_sum_wd8_sse2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                           bw >> 3);
          break;
        }

      case 64:
        if (bh <= 16) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          for (int i = 0; i < bh; i += 16)
            sse_sum_wd8_sse2(data + i * stride, stride, 16, x_sum, x2_sum,
                             bw >> 3);
          break;
        }

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}